

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mum.cc
# Opt level: O1

void mum_hash_test(void *key,int len,uint32_t seed,void *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  bool bVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint64_t *puVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong uVar3;
  undefined1 auVar45 [32];
  undefined1 auVar51 [64];
  
  uVar37 = (ulong)len;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = seed + uVar37;
  uVar31 = SUB168(auVar43 * ZEXT816(0xc42b5e2e6480b23b),8) +
           SUB168(auVar43 * ZEXT816(0xc42b5e2e6480b23b),0);
  if (0x20 < (uint)len) {
    do {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)((long)key + 0x10);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)((long)key + 0x18);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *key;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)((long)key + 8);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = SUB168(ZEXT816(0x32b9b9b97a27ac7d) * auVar22,8);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = SUB168(ZEXT816(0x9ebdcae10d981691) * auVar40,8);
      auVar43 = vpunpcklqdq_avx(auVar56,auVar54);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = SUB168(ZEXT816(0x4b04e0e61401255f) * auVar21,8);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = SUB168(ZEXT816(0x29b5584d83d35bbd) * auVar20,8);
      auVar44 = vpunpcklqdq_avx(auVar58,auVar57);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = SUB168(ZEXT816(0x32b9b9b97a27ac7d) * auVar22,0);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = SUB168(ZEXT816(0x9ebdcae10d981691) * auVar40,0);
      auVar40 = vpunpcklqdq_avx(auVar62,auVar59);
      auVar43 = vpaddq_avx(auVar43,auVar40);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = SUB168(ZEXT816(0x4b04e0e61401255f) * auVar21,0);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = SUB168(ZEXT816(0x29b5584d83d35bbd) * auVar20,0);
      auVar40 = vpunpcklqdq_avx(auVar63,auVar60);
      auVar44 = vpaddq_avx(auVar44,auVar40);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar31;
      auVar40 = vpternlogq_avx512vl(auVar44,auVar43,auVar53,0x96);
      auVar43 = vpshufd_avx(auVar40,0xee);
      uVar37 = uVar37 - 0x20;
      key = (void *)((long)key + 0x20);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = SUB168(auVar40 ^ auVar43,0);
      uVar31 = SUB168(auVar44 * ZEXT816(0x7b51ec3d22f7096f),8) +
               SUB168(auVar44 * ZEXT816(0x7b51ec3d22f7096f),0);
    } while (0x20 < uVar37);
  }
  if (7 < uVar37) {
    auVar55 = ZEXT864(uVar31);
    auVar48 = vpbroadcastq_avx512f();
    puVar39 = _mum_primes;
    uVar31 = 0;
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar50 = vpbroadcastq_avx512f();
      auVar50 = vporq_avx512f(auVar50,auVar49);
      uVar8 = vpcmpuq_avx512f(auVar50,auVar48,2);
      auVar50 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)key + uVar31 * 8));
      bVar6 = (byte)uVar8;
      uVar1 = (ulong)(bVar6 & 1) * auVar50._0_8_;
      auVar41._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar50._8_8_;
      auVar41._0_8_ = uVar1;
      uVar33 = (ulong)((byte)(uVar8 >> 2) & 1) * auVar50._16_8_;
      auVar47._16_8_ = uVar33;
      auVar47._0_16_ = auVar41;
      auVar47._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar50._24_8_;
      auVar52._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar50._32_8_;
      auVar52._0_32_ = auVar47;
      auVar52._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar50._40_8_;
      auVar52._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar50._48_8_;
      auVar52._56_8_ = (uVar8 >> 7) * auVar50._56_8_;
      auVar50 = vmovdqu64_avx512f(*(undefined1 (*) [64])puVar39);
      uVar2 = (ulong)(bVar6 & 1) * auVar50._0_8_;
      auVar42._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar50._8_8_;
      auVar42._0_8_ = uVar2;
      uVar3 = (ulong)((byte)(uVar8 >> 2) & 1) * auVar50._16_8_;
      auVar45._16_8_ = uVar3;
      auVar45._0_16_ = auVar42;
      auVar45._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar50._24_8_;
      auVar51._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar50._32_8_;
      auVar51._0_32_ = auVar45;
      auVar51._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar50._40_8_;
      auVar51._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar50._48_8_;
      auVar51._56_8_ = (uVar8 >> 7) * auVar50._56_8_;
      auVar46 = vextracti64x4_avx512f(auVar52,1);
      uVar4 = vpextrq_avx(auVar46._16_16_,1);
      uVar5 = vpextrq_avx(auVar46._0_16_,1);
      uVar38 = vpextrq_avx(auVar47._16_16_,1);
      uVar34 = vpextrq_avx(auVar41,1);
      auVar47 = vextracti64x4_avx512f(auVar51,1);
      uVar32 = vpextrq_avx(auVar47._0_16_,1);
      uVar35 = vpextrq_avx(auVar45._16_16_,1);
      uVar36 = vpextrq_avx(auVar42,1);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar2;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar1;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar36;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar34;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar3;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar33;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar35;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar38;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = auVar47._0_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = auVar46._0_8_;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar32;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar5;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = auVar47._16_8_;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = auVar46._16_8_;
      uVar33 = vpextrq_avx(auVar47._16_16_,1);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar33;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar4;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = SUB168(auVar16 * auVar30,8);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = SUB168(auVar15 * auVar29,8);
      auVar43 = vpunpcklqdq_avx(auVar64,auVar61);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = SUB168(auVar14 * auVar28,8);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = SUB168(auVar13 * auVar27,8);
      auVar44 = vpunpcklqdq_avx(auVar67,auVar65);
      auVar46._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar46._16_16_ = ZEXT116(1) * auVar43;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = SUB168(auVar12 * auVar26,8);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = SUB168(auVar11 * auVar25,8);
      auVar43 = vpunpcklqdq_avx(auVar69,auVar68);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = SUB168(auVar10 * auVar24,8);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = SUB168(auVar9 * auVar23,8);
      auVar44 = vpunpcklqdq_avx(auVar71,auVar70);
      auVar50 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar43,
                                               ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44)),auVar46
                           ,1);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = SUB168(auVar16 * auVar30,0);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = SUB168(auVar15 * auVar29,0);
      auVar43 = vpunpcklqdq_avx(auVar73,auVar72);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = SUB168(auVar14 * auVar28,0);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = SUB168(auVar13 * auVar27,0);
      auVar44 = vpunpcklqdq_avx(auVar75,auVar74);
      auVar66._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar66._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = SUB168(auVar12 * auVar26,0);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = SUB168(auVar11 * auVar25,0);
      auVar43 = vpunpcklqdq_avx512vl(auVar77,auVar76);
      auVar52 = vmovdqa64_avx512f(auVar55);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = SUB168(auVar10 * auVar24,0);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = SUB168(auVar9 * auVar23,0);
      auVar44 = vpunpcklqdq_avx512vl(auVar79,auVar78);
      auVar55 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar43,
                                               ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44)),auVar66
                           ,1);
      auVar55 = vpaddq_avx512f(auVar50,auVar55);
      auVar55 = vpxorq_avx512f(auVar55,auVar52);
      uVar31 = uVar31 + 8;
      puVar39 = (uint64_t *)((long)puVar39 + 0x40);
    } while (((uVar37 >> 3) + 7 & 0xfffffffffffffff8) != uVar31);
    auVar48 = vmovdqa64_avx512f(auVar55);
    auVar49._0_8_ = (ulong)(bVar6 & 1) * auVar48._0_8_ | (ulong)!(bool)(bVar6 & 1) * auVar52._0_8_;
    bVar7 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar49._8_8_ = (ulong)bVar7 * auVar48._8_8_ | (ulong)!bVar7 * auVar52._8_8_;
    bVar7 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar49._16_8_ = (ulong)bVar7 * auVar48._16_8_ | (ulong)!bVar7 * auVar52._16_8_;
    bVar7 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar49._24_8_ = (ulong)bVar7 * auVar48._24_8_ | (ulong)!bVar7 * auVar52._24_8_;
    bVar7 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar49._32_8_ = (ulong)bVar7 * auVar48._32_8_ | (ulong)!bVar7 * auVar52._32_8_;
    bVar7 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar49._40_8_ = (ulong)bVar7 * auVar48._40_8_ | (ulong)!bVar7 * auVar52._40_8_;
    bVar7 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar49._48_8_ = (ulong)bVar7 * auVar48._48_8_ | (ulong)!bVar7 * auVar52._48_8_;
    auVar49._56_8_ = (uVar8 >> 7) * auVar48._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar52._56_8_;
    auVar47 = vextracti64x4_avx512f(auVar49,1);
    auVar48 = vpxorq_avx512f(auVar49,ZEXT3264(auVar47));
    auVar44 = auVar48._0_16_ ^ auVar48._16_16_;
    auVar43 = vpshufd_avx(auVar44,0xee);
    uVar31 = auVar44._0_8_ ^ auVar43._0_8_;
  }
  uVar33 = (ulong)((uint)uVar37 & 0x38);
  switch((uint)uVar37 & 7) {
  case 0:
    goto switchD_00176ebe_caseD_0;
  case 1:
    uVar33 = (ulong)*(byte *)((long)key + uVar33);
    break;
  case 2:
    uVar33 = (ulong)*(ushort *)((long)key + uVar33);
    break;
  case 3:
    uVar37 = (ulong)*(ushort *)((long)key + uVar33);
    uVar33 = (ulong)*(byte *)((long)key + uVar33 + 2) << 0x10;
    goto LAB_00176f39;
  case 4:
    uVar33 = (ulong)*(uint *)((long)key + uVar33);
    break;
  case 5:
    uVar37 = (ulong)*(uint *)((long)key + uVar33);
    uVar33 = (ulong)*(byte *)((long)key + uVar33 + 4) << 0x20;
    goto LAB_00176f39;
  case 6:
    uVar33 = (ulong)CONCAT15(*(undefined1 *)((long)key + uVar33 + 5),
                             CONCAT14(*(undefined1 *)((long)key + uVar33 + 4),
                                      *(undefined4 *)((long)key + uVar33)));
    break;
  case 7:
    uVar37 = (ulong)CONCAT15(*(undefined1 *)((long)key + uVar33 + 5),
                             CONCAT14(*(undefined1 *)((long)key + uVar33 + 4),
                                      *(undefined4 *)((long)key + uVar33)));
    uVar33 = (ulong)*(byte *)((long)key + uVar33 + 6) << 0x30;
LAB_00176f39:
    uVar33 = uVar33 | uVar37;
  }
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar33;
  uVar31 = uVar31 ^ SUB168(auVar17 * ZEXT816(0xaf47d47c99b1461b),8) +
                    SUB168(auVar17 * ZEXT816(0xaf47d47c99b1461b),0);
switchD_00176ebe_caseD_0:
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar31;
  uVar31 = SUB168(auVar18 * ZEXT816(0xa9a7ae7ceff79f3f),8) +
           SUB168(auVar18 * ZEXT816(0xa9a7ae7ceff79f3f),0) ^ uVar31;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar31;
  *(ulong *)out =
       SUB168(auVar19 * ZEXT816(0xaf47d47c99b1461b),8) +
       SUB168(auVar19 * ZEXT816(0xaf47d47c99b1461b),0) ^ uVar31;
  return;
}

Assistant:

void mum_hash_test(const void *key, int len, uint32_t seed, void *out) {
  *(uint64_t *)out = mum_hash(key, len, seed);
}